

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int luaK_codek(FuncState *fs,int reg,int k)

{
  int iVar1;
  uint i;
  
  if (k < 0x20000) {
    i = reg << 7 | k << 0xf | 3;
  }
  else {
    luaK_code(fs,reg << 7 | 4);
    i = k << 7 | 0x52;
  }
  iVar1 = luaK_code(fs,i);
  return iVar1;
}

Assistant:

static int luaK_codek (FuncState *fs, int reg, int k) {
  if (k <= MAXARG_Bx)
    return luaK_codeABx(fs, OP_LOADK, reg, k);
  else {
    int p = luaK_codeABx(fs, OP_LOADKX, reg, 0);
    codeextraarg(fs, k);
    return p;
  }
}